

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O2

int graph_5_4::dfs_traverse(m_graph g)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int v;
  int iVar6;
  ulong uVar7;
  undefined4 extraout_var;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  m_graph *pmVar12;
  undefined8 *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uStackY_1f8;
  undefined8 uStackY_1f0;
  m_graph in_stack_fffffffffffffe38;
  uint uStack_8;
  
  uVar10 = 0;
  uVar7 = (ulong)(uint)g.vnum;
  if (g.vnum < 1) {
    uVar7 = uVar10;
  }
  piVar8 = &visited;
  for (; uVar7 * 4 != uVar10; uVar10 = uVar10 + 4) {
    *(undefined4 *)((long)&visited + uVar10) = 0;
  }
  iVar6 = 0;
  do {
    v = iVar6;
    iVar1 = *piVar8;
    piVar8 = piVar8 + 1;
    iVar6 = v + 1;
  } while (iVar1 != 0);
  pmVar12 = &g;
  puVar13 = (undefined8 *)&stack0xfffffffffffffe38;
  for (lVar9 = 0x38; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar13 = *(undefined8 *)pmVar12->arc[0];
    pmVar12 = (m_graph *)(pmVar12->arc[0] + 2);
    puVar13 = puVar13 + 1;
  }
  iVar6 = dfs(in_stack_fffffffffffffe38,v);
  uStackY_1f0 = CONCAT44(extraout_var,iVar6);
  uVar7 = (ulong)uStack_8;
  lVar4 = -(uVar7 * 4 + 0xf & 0xfffffffffffffff0);
  lVar5 = lVar4 + -0x1f0;
  *(undefined8 *)((long)&uStackY_1f8 + lVar4) = 1;
  for (lVar9 = *(long *)((long)&uStackY_1f8 + lVar4); lVar9 < (int)uStack_8; lVar9 = lVar9 + 1) {
    *(undefined4 *)((long)&uStackY_1f0 + lVar9 * 4 + lVar5 + 0x1f0) =
         *(undefined4 *)(&stack0xfffffffffffffe40 + lVar9 * 4);
  }
  *(undefined8 *)((long)&uStackY_1f8 + lVar4) = 0xffffffffffffffff;
  uVar10 = *(ulong *)((long)&uStackY_1f8 + lVar4);
  *(undefined8 *)((long)&uStackY_1f8 + lVar4) = 1;
  uVar3 = *(ulong *)((long)&uStackY_1f8 + lVar4);
  do {
    uVar14 = 0;
    uVar16 = uVar10 & 0xffffffff;
    for (uVar15 = uVar3; uVar15 != uVar7; uVar15 = uVar15 + 1) {
      uVar2 = *(uint *)((long)&uStackY_1f0 + uVar15 * 4 + lVar5 + 0x1f0);
      if (uVar2 != 0 && (int)uVar2 < (int)uVar16) {
        uVar14 = uVar15 & 0xffffffff;
        uVar16 = (ulong)uVar2;
      }
      *(undefined4 *)((long)&uStackY_1f0 + (long)(int)uVar14 * 4 + lVar5 + 0x1f0) = 0;
      for (uVar11 = uVar3; uVar7 != uVar11; uVar11 = uVar11 + 1) {
        iVar6 = *(int *)((long)&uStackY_1f0 + uVar11 * 4 + lVar5 + 0x1f0);
        if ((iVar6 != 0) &&
           (*(int *)(&stack0xfffffffffffffe40 + uVar11 * 4 + (long)(int)uVar14 * 0x28) < iVar6)) {
          *(int *)((long)&uStackY_1f0 + uVar11 * 4 + lVar5 + 0x1f0) =
               *(int *)(&stack0xfffffffffffffe40 + uVar11 * 4 + (long)(int)uVar14 * 0x28);
        }
      }
    }
  } while( true );
}

Assistant:

int dfs_traverse(m_graph g) {
        for (int i = 0; i < g.vnum; i++)
            visited[i] = 0;

        for (int j = 0; j < g.vnum; j++) {
            if (visited[j] == 0)
                dfs(g, j);
        }
    }